

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm *
sqlite3WhereFindTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  WhereClause *pWVar1;
  ulong in_RCX;
  WhereScan *in_RDI;
  ushort in_R8W;
  WhereScan *in_R9;
  long in_FS_OFFSET;
  WhereTerm *p;
  WhereTerm *pResult;
  WhereScan scan;
  Index *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  u32 opMask;
  undefined1 *puVar2;
  WhereClause *pWC_00;
  WhereClause *local_80;
  undefined1 local_78 [112];
  long local_8;
  
  opMask = (u32)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pWC_00 = (WhereClause *)0x0;
  puVar2 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_78,0xaa,0x70);
  pWVar1 = (WhereClause *)
           whereScanInit(in_R9,pWC_00,(int)((ulong)puVar2 >> 0x20),(int)puVar2,opMask,
                         in_stack_ffffffffffffff38);
  while (local_80 = pWC_00, pWVar1 != (WhereClause *)0x0) {
    if (((ulong)pWVar1->aStatic[0].pExpr & in_RCX) == 0) {
      if ((pWVar1->aStatic[0].pExpr == (Expr *)0x0) &&
         (local_80 = pWVar1, (*(ushort *)&pWVar1->nTerm & in_R8W & 0x82) != 0)) break;
      if (pWC_00 == (WhereClause *)0x0) {
        pWC_00 = pWVar1;
      }
    }
    pWVar1 = (WhereClause *)whereScanNext(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (WhereTerm *)local_80;
}

Assistant:

SQLITE_PRIVATE WhereTerm *sqlite3WhereFindTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  op &= WO_EQ|WO_IS;
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&op)!=0 ){
        testcase( p->eOperator & WO_IS );
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}